

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

string * extractFileExt(string *__return_storage_ptr__,string *src)

{
  long lVar1;
  long lVar2;
  string rez;
  _Alloc_hider local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  lVar1 = src->_M_string_length + 1;
  do {
    lVar2 = lVar1;
    if (lVar2 == 2) goto LAB_001f7a52;
    lVar1 = lVar2 + -1;
  } while ((src->_M_dataplus)._M_p[lVar2 + -2] != '.');
  std::__cxx11::string::substr((ulong)&local_38,(ulong)src);
  if ((local_30 == 0) || (local_38._M_p[local_30 - 1] != '\"')) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_38._M_p == &local_28) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_27,local_28);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_20;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_38._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_27,local_28);
    }
    __return_storage_ptr__->_M_string_length = local_30;
    local_30 = 0;
    local_28 = '\0';
    local_38._M_p = &local_28;
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_38);
  }
  if (local_38._M_p != &local_28) {
    operator_delete(local_38._M_p,CONCAT71(uStack_27,local_28) + 1);
  }
  if (lVar2 == 2) {
LAB_001f7a52:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

string extractFileExt(const string& src)
{
    for (size_t i = src.size() - 1; i > 0; i--)
        if (src[i] == '.')
        {
            string rez = src.substr(i + 1);
            if (!rez.empty() && rez[rez.size() - 1] == '\"')
                return rez.substr(0, rez.size() - 1);
            return rez;
        }
    return "";
}